

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

PacketBuilder * __thiscall PacketBuilder::AddVar(PacketBuilder *this,int min,int max,int num)

{
  if (min < 2) {
    if (max < 2 || (uint)num < 0xfd) {
      AddChar(this,num);
      return this;
    }
LAB_00166b15:
    if (max < 3 || (uint)num < 0xfa09) {
      AddShort(this,num);
      return this;
    }
  }
  else {
    if (min == 2) goto LAB_00166b15;
    if (3 < (uint)min) goto LAB_00166b5a;
  }
  if (max < 4 || (uint)num < 0xf71ae5) {
    AddThree(this,num);
    return this;
  }
LAB_00166b5a:
  AddInt(this,num);
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddVar(int min, int max, int num)
{
	if (min <= 1 && (max <= 1 || num < PacketProcessor::MAX1))
		this->AddChar(num);
	else if (min <= 2 && (max <= 2 || num < PacketProcessor::MAX2))
		this->AddShort(num);
	else if (min <= 3 && (max <= 3 || num < PacketProcessor::MAX3))
		this->AddThree(num);
	else
		this->AddInt(num);

	return *this;
}